

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

iterator divsufsortxx::helper::
         median5<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                   (iterator Td,iterator v1,iterator v2,iterator v3,iterator v4,iterator v5)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  BitmapArray<long> *pBVar3;
  iterator *piVar4;
  pos_type pVar5;
  pos_type pVar6;
  BitmapArray<long> *pBVar7;
  iterator local_58;
  pos_type local_48;
  iterator local_40;
  
  pVar6 = Td.pos_;
  pBVar7 = Td.array_;
  local_58.pos_ = v2.pos_;
  local_58.array_ = v2.array_;
  local_48 = v1.pos_;
  pBVar3 = v1.array_;
  local_40.array_ = pBVar3;
  local_40.pos_ = local_48;
  iVar1 = (*((local_58.array_)->super_Bitmap)._vptr_Bitmap[5])(local_58.array_,local_58.pos_);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var,iVar1) + pVar6);
  iVar2 = (*((v3.array_)->super_Bitmap)._vptr_Bitmap[5])(v3.array_,v3.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_01,iVar2) + pVar6);
  if (CONCAT44(extraout_var_02,iVar2) < CONCAT44(extraout_var_00,iVar1)) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_58,&v3);
  }
  iVar1 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_03,iVar1) + pVar6);
  iVar2 = (*((v5.array_)->super_Bitmap)._vptr_Bitmap[5])(v5.array_,v5.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_05,iVar2) + pVar6);
  if (CONCAT44(extraout_var_06,iVar2) < CONCAT44(extraout_var_04,iVar1)) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&v4,&v5);
  }
  iVar1 = (*((local_58.array_)->super_Bitmap)._vptr_Bitmap[5])(local_58.array_,local_58.pos_);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_07,iVar1) + pVar6);
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_09,iVar2) + pVar6);
  if (CONCAT44(extraout_var_10,iVar2) < CONCAT44(extraout_var_08,iVar1)) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_58,&v4);
    std::swap<bitmap::BitmapArray<long>::iterator>(&v3,&v5);
  }
  pVar5 = local_48;
  iVar1 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,local_48);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_11,iVar1) + pVar6);
  iVar2 = (*((v3.array_)->super_Bitmap)._vptr_Bitmap[5])(v3.array_,v3.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_13,iVar2) + pVar6);
  if (CONCAT44(extraout_var_14,iVar2) < CONCAT44(extraout_var_12,iVar1)) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_40,&v3);
    pVar5 = local_40.pos_;
    pBVar3 = local_40.array_;
  }
  iVar1 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,pVar5);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_15,iVar1) + pVar6);
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_17,iVar2) + pVar6);
  if (CONCAT44(extraout_var_18,iVar2) < CONCAT44(extraout_var_16,iVar1)) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_40,&v4);
    std::swap<bitmap::BitmapArray<long>::iterator>(&v3,&v5);
  }
  iVar1 = (*((v3.array_)->super_Bitmap)._vptr_Bitmap[5])(v3.array_,v3.pos_);
  iVar1 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,CONCAT44(extraout_var_19,iVar1) + pVar6);
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar6 + CONCAT44(extraout_var_21,iVar2));
  piVar4 = &v3;
  if (CONCAT44(extraout_var_22,iVar2) < CONCAT44(extraout_var_20,iVar1)) {
    piVar4 = &v4;
  }
  return *piVar4;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}